

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keygen-noise.c
# Opt level: O3

char * get_random_data(int len,char *device)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ssize_t sVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  pcVar3 = (char *)safemalloc((long)len,1,0);
  if (device == (char *)0x0) {
    lVar5 = 0;
    bVar1 = true;
    do {
      bVar8 = bVar1;
      device = get_random_data::default_devices[lVar5];
      iVar2 = access(device,4);
      if (iVar2 == 0) goto LAB_0010d6ac;
      lVar5 = 1;
      bVar1 = false;
    } while (bVar8);
    get_random_data_cold_1();
  }
  else {
LAB_0010d6ac:
    iVar2 = open(device,0);
    if (-1 < iVar2) {
      if (0 < len) {
        uVar7 = 0;
        do {
          sVar4 = read(iVar2,pcVar3 + uVar7,(long)(len - (int)uVar7));
          if ((int)sVar4 < 0) {
            get_random_data_cold_2();
            return (char *)0x0;
          }
          uVar6 = (int)uVar7 + (int)sVar4;
          uVar7 = (ulong)uVar6;
        } while ((int)uVar6 < len);
      }
      close(iVar2);
      return pcVar3;
    }
    get_random_data_cold_3();
  }
  return (char *)0x0;
}

Assistant:

char *get_random_data(int len, const char *device)
{
    char *buf = snewn(len, char);
    int fd;
    int ngot, ret;

    if (!device) {
        static const char *const default_devices[] = {
            "/dev/urandom", "/dev/random"
        };
        size_t i;

        for (i = 0; i < lenof(default_devices); i++) {
            if (access(default_devices[i], R_OK) == 0) {
                device = default_devices[i];
                break;
            }
        }

        if (!device) {
            sfree(buf);
            fprintf(stderr, "puttygen: cannot find a readable "
                    "random number source; use --random-device\n");
            return NULL;
        }
    }

    fd = open(device, O_RDONLY);
    if (fd < 0) {
        sfree(buf);
        fprintf(stderr, "puttygen: %s: open: %s\n",
                device, strerror(errno));
        return NULL;
    }

    ngot = 0;
    while (ngot < len) {
        ret = read(fd, buf+ngot, len-ngot);
        if (ret < 0) {
            close(fd);
            sfree(buf);
            fprintf(stderr, "puttygen: %s: read: %s\n",
                    device, strerror(errno));
            return NULL;
        }
        ngot += ret;
    }

    close(fd);

    return buf;
}